

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

Mat * ncnn::Mat::from_float16(Mat *__return_storage_ptr__,unsigned_short *data,int size)

{
  ushort uVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  
  Mat(__return_storage_ptr__,size,4,(Allocator *)0x0);
  puVar2 = (uint *)__return_storage_ptr__->data;
  if ((puVar2 != (uint *)0x0) &&
     ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
    for (; 0 < size; size = size + -1) {
      uVar1 = *data;
      uVar4 = (uint)(uVar1 >> 0xf);
      uVar5 = uVar1 >> 10 & 0x1f;
      if (uVar5 == 0x1f) {
        uVar4 = (uint)uVar1 << 0xd | uVar4 << 0x1f | 0x7f800000;
      }
      else {
        uVar3 = uVar1 & 0x3ff;
        if ((uVar1 >> 10 & 0x1f) == 0) {
          if ((short)uVar3 == 0) {
            uVar4 = uVar4 << 0x1f;
          }
          else {
            iVar6 = 0;
            while (uVar5 = uVar3 >> 9, uVar3 = uVar3 * 2, (uVar5 & 1) == 0) {
              iVar6 = iVar6 + 1;
            }
            uVar4 = (uVar3 & 0x3fe) << 0xd | iVar6 * -0x800000 + 0x38000000U | uVar4 << 0x1f;
          }
        }
        else {
          uVar4 = uVar3 * 0x2000 + (uVar5 << 0x17 | uVar4 << 0x1f) + 0x38000000;
        }
      }
      *puVar2 = uVar4;
      data = data + 1;
      puVar2 = puVar2 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::from_float16(const unsigned short* data, int size)
{
    Mat m(size);
    if (m.empty())
        return m;

    float* ptr = m;//.data;

#if __ARM_NEON && (__ARM_FP & 2)
    int nn = cpu_support_arm_vfpv4() ? size >> 2 : 0;
    int remain = size - (nn << 2);
#else
    int remain = size;
#endif // __ARM_NEON

#if __ARM_NEON && (__ARM_FP & 2)
#if __aarch64__
    if (nn > 0)
    {
    asm volatile(
        "0:                             \n"
        "ld1    {v0.4h}, [%1], #8       \n"
        "fcvtl  v1.4s, v0.4h            \n"
        "subs   %w0, %w0, #1            \n"
        "st1    {v1.4s}, [%2], #16      \n"
        "bne    0b                      \n"
        : "=r"(nn),     // %0
          "=r"(data),   // %1
          "=r"(ptr)     // %2
        : "0"(nn),
          "1"(data),
          "2"(ptr)
        : "cc", "memory", "v0", "v1"
    );
    }
#else
    if (nn > 0)
    {
    asm volatile(
        "0:                             \n"
        "pld        [%1, #64]           \n"
        "vld1.s16   {d0}, [%1 :64]!     \n"
        "vcvt.f32.f16 q1, d0            \n"
        "subs       %0, #1              \n"
        "vst1.f32   {d2-d3}, [%2 :128]! \n"
        "bne        0b                  \n"
        : "=r"(nn),     // %0
          "=r"(data),   // %1
          "=r"(ptr)     // %2
        : "0"(nn),
          "1"(data),
          "2"(ptr)
        : "cc", "memory", "q0", "q1"
    );
    }
#endif // __aarch64__
#endif // __ARM_NEON
    for (; remain>0; remain--)
    {
        *ptr = half2float(*data);

        data++;
        ptr++;
    }

    return m;
}